

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteGlobalSettings(FBXExporter *this)

{
  shared_ptr<Assimp::IOStream> local_548;
  allocator local_531;
  string local_530;
  allocator local_509;
  string local_508;
  allocator local_4e1;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  undefined1 local_150 [8];
  Node p;
  string local_d8;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  Node gs;
  FBXExporter *this_local;
  
  gs.property_start = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"GlobalSettings",&local_a1);
  FBX::Node::Node((Node *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"Version",(allocator *)((long)&p.property_start + 7));
  FBX::Node::AddChild<int>((Node *)local_80,&local_d8,1000);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p.property_start + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"Properties70",&local_171);
  FBX::Node::Node((Node *)local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"UpAxis",&local_199);
  FBX::Node::AddP70int((Node *)local_150,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"UpAxisSign",&local_1c1);
  FBX::Node::AddP70int((Node *)local_150,&local_1c0,1);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"FrontAxis",&local_1e9);
  FBX::Node::AddP70int((Node *)local_150,&local_1e8,2);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"FrontAxisSign",&local_211);
  FBX::Node::AddP70int((Node *)local_150,&local_210,1);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"CoordAxis",&local_239);
  FBX::Node::AddP70int((Node *)local_150,&local_238,0);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"CoordAxisSign",&local_261);
  FBX::Node::AddP70int((Node *)local_150,&local_260,1);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"OriginalUpAxis",&local_289);
  FBX::Node::AddP70int((Node *)local_150,&local_288,1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"OriginalUpAxisSign",&local_2b1);
  FBX::Node::AddP70int((Node *)local_150,&local_2b0,1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"UnitScaleFactor",&local_2d9);
  FBX::Node::AddP70double((Node *)local_150,&local_2d8,1.0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"OriginalUnitScaleFactor",&local_301);
  FBX::Node::AddP70double((Node *)local_150,&local_300,1.0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"AmbientColor",&local_329);
  FBX::Node::AddP70color((Node *)local_150,&local_328,0.0,0.0,0.0);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"DefaultCamera",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"Producer Perspective",&local_379);
  FBX::Node::AddP70string((Node *)local_150,&local_350,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"TimeMode",&local_3a1);
  FBX::Node::AddP70enum((Node *)local_150,&local_3a0,0xb);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"TimeProtocol",&local_3c9);
  FBX::Node::AddP70enum((Node *)local_150,&local_3c8,2);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"SnapOnFrameMode",&local_3f1);
  FBX::Node::AddP70enum((Node *)local_150,&local_3f0,0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"TimeSpanStart",&local_419);
  FBX::Node::AddP70time((Node *)local_150,&local_418,0);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"TimeSpanStop",&local_441);
  FBX::Node::AddP70time((Node *)local_150,&local_440,0xac0e8d7b0);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"CustomFrameRate",&local_469);
  FBX::Node::AddP70double((Node *)local_150,&local_468,-1.0);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"TimeMarker",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"Compound",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,"",&local_509);
  FBX::Node::AddP70<>((Node *)local_150,&local_490,&local_4b8,&local_4e0,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_530,"CurrentTimeMarker",&local_531);
  FBX::Node::AddP70int((Node *)local_150,&local_530,-1);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  FBX::Node::AddChild((Node *)local_80,(Node *)local_150);
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_548,&this->outfile);
  FBX::Node::Dump((Node *)local_80,&local_548,(bool)(this->binary & 1),0);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_548);
  FBX::Node::~Node((Node *)local_150);
  FBX::Node::~Node((Node *)local_80);
  return;
}

Assistant:

void FBXExporter::WriteGlobalSettings ()
{
    if (!binary) {
        // no title, follows directly from the header extension
    }
    FBX::Node gs("GlobalSettings");
    gs.AddChild("Version", int32_t(1000));

    FBX::Node p("Properties70");
    p.AddP70int("UpAxis", 1);
    p.AddP70int("UpAxisSign", 1);
    p.AddP70int("FrontAxis", 2);
    p.AddP70int("FrontAxisSign", 1);
    p.AddP70int("CoordAxis", 0);
    p.AddP70int("CoordAxisSign", 1);
    p.AddP70int("OriginalUpAxis", 1);
    p.AddP70int("OriginalUpAxisSign", 1);
    p.AddP70double("UnitScaleFactor", 1.0);
    p.AddP70double("OriginalUnitScaleFactor", 1.0);
    p.AddP70color("AmbientColor", 0.0, 0.0, 0.0);
    p.AddP70string("DefaultCamera", "Producer Perspective");
    p.AddP70enum("TimeMode", 11);
    p.AddP70enum("TimeProtocol", 2);
    p.AddP70enum("SnapOnFrameMode", 0);
    p.AddP70time("TimeSpanStart", 0); // TODO: animation support
    p.AddP70time("TimeSpanStop", FBX::SECOND); // TODO: animation support
    p.AddP70double("CustomFrameRate", -1.0);
    p.AddP70("TimeMarker", "Compound", "", ""); // not sure what this is
    p.AddP70int("CurrentTimeMarker", -1);
    gs.AddChild(p);

    gs.Dump(outfile, binary, 0);
}